

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_to_storage(secp256k1_ge_storage *r,secp256k1_ge *a)

{
  ulong uVar1;
  ulong uVar2;
  secp256k1_ge *psVar3;
  secp256k1_ge *r_00;
  secp256k1_ge *a_00;
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe local_78;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  undefined8 uStack_20;
  
  a_00 = (secp256k1_ge *)&local_78;
  psVar3 = a;
  r_00 = a;
  secp256k1_ge_verify(a);
  if (a->infinity == 0) {
    local_48 = (a->x).n[0];
    uStack_40 = (a->x).n[1];
    local_38 = (a->x).n[2];
    uStack_30 = (a->x).n[3];
    local_28 = (a->x).n[4];
    uStack_20._0_4_ = (a->x).magnitude;
    uStack_20._4_4_ = (a->x).normalized;
    r_00 = (secp256k1_ge *)&stack0xffffffffffffffb8;
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    local_78.n[0] = (a->y).n[0];
    local_78.n[1] = (a->y).n[1];
    local_78.n[2] = (a->y).n[2];
    local_78.n[3] = (a->y).n[3];
    local_78.n[4] = (a->y).n[4];
    local_78.magnitude = (a->y).magnitude;
    local_78.normalized = (a->y).normalized;
    secp256k1_fe_normalize(&local_78);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (uStack_20._4_4_ != 0) {
      (r->x).n[0] = uStack_40 << 0x34 | local_48;
      (r->x).n[1] = local_38 << 0x28 | uStack_40 >> 0xc;
      (r->x).n[2] = uStack_30 << 0x1c | local_38 >> 0x18;
      (r->x).n[3] = local_28 << 0x10 | uStack_30 >> 0x24;
      secp256k1_fe_verify(&local_78);
      if (local_78.normalized != 0) {
        (r->y).n[0] = local_78.n[1] << 0x34 | local_78.n[0];
        (r->y).n[1] = local_78.n[2] << 0x28 | local_78.n[1] >> 0xc;
        (r->y).n[2] = local_78.n[3] << 0x1c | local_78.n[2] >> 0x18;
        (r->y).n[3] = local_78.n[4] << 0x10 | local_78.n[3] >> 0x24;
        return;
      }
      goto LAB_0013fb20;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_00 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_0013fb20:
  secp256k1_ge_to_storage_cold_2();
  (a_00->x).n[0] = (psVar3->x).n[0] & 0xfffffffffffff;
  (a_00->x).n[1] = ((psVar3->x).n[1] & 0xffffffffff) << 0xc | (psVar3->x).n[0] >> 0x34;
  (a_00->x).n[2] = ((psVar3->x).n[2] & 0xfffffff) << 0x18 | (psVar3->x).n[1] >> 0x28;
  (a_00->x).n[3] = ((psVar3->x).n[3] & 0xffff) << 0x24 | (psVar3->x).n[2] >> 0x1c;
  (a_00->x).n[4] = (psVar3->x).n[3] >> 0x10;
  (a_00->x).magnitude = 1;
  (a_00->x).normalized = 1;
  secp256k1_fe_verify(&a_00->x);
  (a_00->y).n[0] = (psVar3->x).n[4] & 0xfffffffffffff;
  uVar1._0_4_ = (psVar3->x).magnitude;
  uVar1._4_4_ = (psVar3->x).normalized;
  (a_00->y).n[1] = (uVar1 & 0xffffffffff) << 0xc | (psVar3->x).n[4] >> 0x34;
  uVar2._0_4_ = (psVar3->x).magnitude;
  uVar2._4_4_ = (psVar3->x).normalized;
  (a_00->y).n[2] = ((psVar3->y).n[0] & 0xfffffff) << 0x18 | uVar2 >> 0x28;
  (a_00->y).n[3] = ((psVar3->y).n[1] & 0xffff) << 0x24 | (psVar3->y).n[0] >> 0x1c;
  (a_00->y).n[4] = (psVar3->y).n[1] >> 0x10;
  (a_00->y).magnitude = 1;
  (a_00->y).normalized = 1;
  secp256k1_fe_verify(&a_00->y);
  a_00->infinity = 0;
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

static void secp256k1_ge_to_storage(secp256k1_ge_storage *r, const secp256k1_ge *a) {
    secp256k1_fe x, y;
    SECP256K1_GE_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    x = a->x;
    secp256k1_fe_normalize(&x);
    y = a->y;
    secp256k1_fe_normalize(&y);
    secp256k1_fe_to_storage(&r->x, &x);
    secp256k1_fe_to_storage(&r->y, &y);
}